

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyGraph.cpp
# Opt level: O0

History * pgi::get_history(path_t *p,PolicyGraph *g)

{
  edge_descriptor e_00;
  bool bVar1;
  unsigned_long uVar2;
  vertex_bundled *pvVar3;
  adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
  *in_RDX;
  pointer in_RSI;
  History *in_RDI;
  edge_desc_impl<boost::bidirectional_tag,_unsigned_long> *e;
  const_iterator __end1;
  const_iterator __begin1;
  path_t *__range1;
  History *h;
  vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
  *in_stack_ffffffffffffff28;
  __normal_iterator<const_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff30;
  ActionObservation *__args;
  vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_> *in_stack_ffffffffffffff40
  ;
  _List_node_base **in_stack_ffffffffffffff48;
  adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
  *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_> *in_stack_ffffffffffffff60
  ;
  adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
  *this;
  History *pHVar4;
  adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
  local_60;
  undefined1 local_19;
  adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
  *local_18;
  pointer local_10;
  
  local_19 = 0;
  pHVar4 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::vector
            ((vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_> *)0x2cc619);
  std::
  vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
  ::size((vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
          *)local_10);
  std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::reserve
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_60.super_type.m_vertices.
  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_10;
  local_60.super_type.m_vertices.
  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
                ::begin(in_stack_ffffffffffffff28);
  local_60.super_type.m_vertices.
  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
                ::end(in_stack_ffffffffffffff28);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff30,
                            (__normal_iterator<const_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>_>
                             *)in_stack_ffffffffffffff28), bVar1) {
    local_60.super_type.m_edges.
    super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
    ._M_impl._M_node._M_size =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>_>
                 ::operator*((__normal_iterator<const_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>_>
                              *)((long)&local_60.super_type.m_vertices.
                                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
                                        ._M_impl.super__Vector_impl_data + 8));
    this = &local_60;
    uVar2 = boost::
            source<boost::bidirectional_tag,unsigned_long,boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>
                      ((edge_base<boost::bidirectional_tag,_unsigned_long> *)
                       local_60.super_type.m_edges.
                       super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
                       ._M_impl._M_node._M_size,local_18);
    pvVar3 = boost::
             adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
             ::operator[](in_stack_ffffffffffffff50,(vertex_descriptor)in_stack_ffffffffffffff48);
    (this->super_type).m_edges.
    super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)*pvVar3;
    in_stack_ffffffffffffff48 =
         (_List_node_base **)
         ((long)&local_60.super_type.m_edges.
                 super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
                 ._M_impl._M_node + 8);
    __args = *(ActionObservation **)
              (local_60.super_type.m_edges.
               super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
               ._M_impl._M_node._M_size + 0x10);
    in_stack_ffffffffffffff28 =
         (vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
          *)((edge_base<boost::bidirectional_tag,_unsigned_long> *)
            local_60.super_type.m_edges.
            super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
            ._M_impl._M_node._M_size)->m_source;
    in_stack_ffffffffffffff30 =
         (__normal_iterator<const_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>_>
          *)((edge_base<boost::bidirectional_tag,_unsigned_long> *)
            local_60.super_type.m_edges.
            super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
            ._M_impl._M_node._M_size)->m_target;
    e_00.super_edge_base<boost::bidirectional_tag,_unsigned_long>.m_target = (unsigned_long)in_RDI;
    e_00.super_edge_base<boost::bidirectional_tag,_unsigned_long>.m_source = uVar2;
    e_00.m_eproperty = pHVar4;
    in_stack_ffffffffffffff50 =
         (adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
          *)boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
            ::operator[](this,e_00);
    *in_stack_ffffffffffffff48 =
         (in_stack_ffffffffffffff50->super_type).m_edges.
         super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::
    emplace_back<pgi::ActionObservation>(in_stack_ffffffffffffff40,__args);
    __gnu_cxx::
    __normal_iterator<const_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>_>
    ::operator++((__normal_iterator<const_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>_>
                  *)((long)&local_60.super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data + 8));
  }
  return in_RDI;
}

Assistant:

History get_history(const path_t& p, const PolicyGraph& g) {
  History h;
  h.reserve(p.size());
  for (const auto& e : p) {
    h.emplace_back(ActionObservation{g[boost::source(e, g)], g[e]});
  }
  return h;
}